

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QKeyCombination>>
                 (QDebug *debug,char *which,QList<QKeyCombination> *c)

{
  bool bVar1;
  const_iterator cVar2;
  QDebug *o;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  Stream *this;
  QDebug local_58;
  QDebug in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  const_iterator t;
  QDebug local_38;
  QDebug local_30;
  QKeyCombination *local_28;
  const_iterator local_20;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RDX,in_stack_ffffffffffffffb8);
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  cVar2 = QList<QKeyCombination>::begin((QList<QKeyCombination> *)this);
  local_20.i = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QKeyCombination *)QList<QKeyCombination>::end((QList<QKeyCombination> *)this);
  local_20 = (const_iterator)local_28;
  bVar1 = QList<QKeyCombination>::const_iterator::operator!=
                    ((const_iterator *)&stack0xffffffffffffffe8,(const_iterator)local_28);
  if (bVar1) {
    QDebug::QDebug(&local_38,in_RSI);
    QList<QKeyCombination>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffffe8);
    ::operator<<((QDebug *)in_stack_ffffffffffffffb0.stream,
                 (QKeyCombination)(int)((ulong)cVar2.i >> 0x20));
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QList<QKeyCombination>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffe8);
  }
  while (t.i = local_20.i,
        bVar1 = QList<QKeyCombination>::const_iterator::operator!=
                          ((const_iterator *)&stack0xffffffffffffffe8,local_20), bVar1) {
    o = QDebug::operator<<(in_RDX,(char *)t.i);
    QDebug::QDebug(&local_58,o);
    QList<QKeyCombination>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffffe8);
    ::operator<<((QDebug *)in_stack_ffffffffffffffb0.stream,
                 (QKeyCombination)(int)((ulong)cVar2.i >> 0x20));
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffb0);
    QDebug::~QDebug(&local_58);
    QList<QKeyCombination>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffe8);
  }
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QDebug::QDebug((QDebug *)this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}